

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void char_callback(GLFWwindow *window,uint codepoint)

{
  uint uVar1;
  undefined1 uVar2;
  uint uVar3;
  void *pvVar4;
  char string [5];
  uint local_20;
  undefined1 local_1c;
  
  uVar2 = (undefined1)codepoint;
  pvVar4 = glfwGetWindowUserPointer(window);
  uVar3 = counter;
  local_1c = 0;
  local_20 = 0;
  if (codepoint < 0x80) {
    local_20 = codepoint & 0xff;
  }
  else if (codepoint < 0x800) {
    local_20 = (ushort)(CONCAT11(uVar2,(char)(codepoint >> 6)) | 0xc0) & 0xffff3fff | 0x8000;
  }
  else if (codepoint < 0x10000) {
    local_20 = (CONCAT12(uVar2,CONCAT11((char)(codepoint >> 6),(char)(codepoint >> 0xc))) & 0xff3fff
               | 0x80e0) & 0xff3fffff | 0x800000;
  }
  else if (codepoint < 0x110000) {
    local_20 = CONCAT13(uVar2,CONCAT12((char)(codepoint >> 6),
                                       CONCAT11((char)(codepoint >> 0xc),(char)(codepoint >> 0x12)))
                       ) & 0x3f3f3fff | 0x808080f0;
  }
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar4 + 8);
  glfwGetTime();
  printf("%08x to %i at %0.3f: Character 0x%08x (%s) input\n",(ulong)uVar3,(ulong)uVar1,codepoint,
         &local_20);
  return;
}

Assistant:

static void char_callback(GLFWwindow* window, unsigned int codepoint)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    char string[5] = "";

    encode_utf8(string, codepoint);
    printf("%08x to %i at %0.3f: Character 0x%08x (%s) input\n",
           counter++, slot->number, glfwGetTime(), codepoint, string);
}